

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::MergeFromInternal(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                    *this,MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                          *from)

{
  KeyOnMemory *this_00;
  Arena *this_01;
  int iVar1;
  undefined4 extraout_var;
  CustomModel_CustomModelParamValue *this_02;
  undefined4 extraout_var_00;
  
  if (from->_has_bits_[0] != 0) {
    if ((from->_has_bits_[0] & 1) != 0) {
      this_00 = &this->key_;
      if ((this->key_).ptr_ == (string *)&fixed_address_empty_string_abi_cxx11_) {
        ArenaStringPtr::CreateInstance
                  (this_00,this->arena_,(string *)&fixed_address_empty_string_abi_cxx11_);
      }
      iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x11])(from);
      if (this_00->ptr_ == (string *)&fixed_address_empty_string_abi_cxx11_) {
        ArenaStringPtr::CreateInstance(this_00,this->arena_,(string *)CONCAT44(extraout_var,iVar1));
      }
      else {
        std::__cxx11::string::_M_assign((string *)this_00->ptr_);
      }
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      if (this->value_ == (ValueOnMemory)0x0) {
        this_01 = this->arena_;
        if (this_01 == (Arena *)0x0) {
          this_02 = (CustomModel_CustomModelParamValue *)operator_new(0x20);
          CoreML::Specification::CustomModel_CustomModelParamValue::
          CustomModel_CustomModelParamValue(this_02);
        }
        else {
          this_02 = (CustomModel_CustomModelParamValue *)
                    Arena::AllocateAligned
                              (this_01,(type_info *)
                                       &CoreML::Specification::CustomModel_CustomModelParamValue::
                                        typeinfo,0x20);
          CoreML::Specification::CustomModel_CustomModelParamValue::
          CustomModel_CustomModelParamValue(this_02);
          Arena::AddListNode(this_01,this_02,
                             arena_destruct_object<CoreML::Specification::CustomModel_CustomModelParamValue>
                            );
        }
        this->value_ = this_02;
      }
      iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x12])(from);
      CoreML::Specification::CustomModel_CustomModelParamValue::MergeFrom
                (this->value_,(CustomModel_CustomModelParamValue *)CONCAT44(extraout_var_00,iVar1));
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
    }
  }
  return;
}

Assistant:

void MergeFromInternal(const MapEntryImpl& from) {
    if (from._has_bits_[0]) {
      if (from.has_key()) {
        KeyTypeHandler::EnsureMutable(&key_, GetArenaNoVirtual());
        KeyTypeHandler::Merge(from.key(), &key_, GetArenaNoVirtual());
        set_has_key();
      }
      if (from.has_value()) {
        ValueTypeHandler::EnsureMutable(&value_, GetArenaNoVirtual());
        ValueTypeHandler::Merge(from.value(), &value_, GetArenaNoVirtual());
        set_has_value();
      }
    }
  }